

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::TextFlow::Column::const_iterator::const_iterator(const_iterator *this,Column *column)

{
  bool bVar1;
  size_t sVar2;
  Column *column_local;
  const_iterator *this_local;
  
  this->m_column = column;
  this->m_lineStart = 0;
  this->m_lineLength = 0;
  this->m_parsedTo = 0;
  this->m_addHyphen = false;
  if (this->m_column->m_width <= this->m_column->m_indent) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1b12,"Catch::TextFlow::Column::const_iterator::const_iterator(const Column &)")
    ;
  }
  bVar1 = true;
  if (this->m_column->m_initialIndent != 0xffffffffffffffff) {
    bVar1 = this->m_column->m_initialIndent < this->m_column->m_width;
  }
  if (!bVar1) {
    __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1b14,"Catch::TextFlow::Column::const_iterator::const_iterator(const Column &)")
    ;
  }
  calcLength(this);
  if (this->m_lineLength == 0) {
    sVar2 = std::__cxx11::string::size();
    this->m_lineStart = sVar2;
  }
  return;
}

Assistant:

Column::const_iterator::const_iterator( Column const& column ): m_column( column ) {
            assert( m_column.m_width > m_column.m_indent );
            assert( m_column.m_initialIndent == std::string::npos ||
                    m_column.m_width > m_column.m_initialIndent );
            calcLength();
            if ( m_lineLength == 0 ) {
                m_lineStart = m_column.m_string.size();
            }
        }